

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::IsSimpleJitOriginalEntryPoint(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  EntryPointInfo *this_00;
  JavascriptMethod p_Var3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  FunctionInfo *this_01;
  
  this_00 = (EntryPointInfo *)
            FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
  if (this_00 == (EntryPointInfo *)0x0) {
    bVar2 = false;
  }
  else {
    p_Var3 = EntryPointInfo::GetNativeEntrypoint(this_00);
    this_01 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (this_01 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00764aca;
      *puVar4 = 0;
      this_01 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(this_01->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) {
LAB_00764aca:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      this_01 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    p_Var5 = FunctionInfo::GetOriginalEntryPoint_Unchecked(this_01);
    bVar2 = p_Var3 == p_Var5;
  }
  return bVar2;
}

Assistant:

bool FunctionBody::IsSimpleJitOriginalEntryPoint() const
    {
#if ENABLE_NATIVE_CODEGEN
        const FunctionEntryPointInfo *const simpleJitEntryPointInfo = GetSimpleJitEntryPointInfo();
        return simpleJitEntryPointInfo && simpleJitEntryPointInfo->GetNativeEntrypoint() == GetOriginalEntryPoint_Unchecked();
#else
        return false;
#endif
    }